

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

void __thiscall cfd::core::TapBranch::AddBranch(TapBranch *this,TapBranch *branch)

{
  size_type sVar1;
  CfdException *this_00;
  allocator local_39;
  string local_38;
  TapBranch *local_18;
  TapBranch *branch_local;
  TapBranch *this_local;
  
  local_18 = branch;
  branch_local = this;
  ::std::vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>>::
  emplace_back<cfd::core::TapBranch_const&>
            ((vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>> *)
             &this->branch_list_,branch);
  sVar1 = ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::size
                    (&this->branch_list_);
  if (0x80 < sVar1) {
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_38,"tapbranch maximum over.",&local_39);
    CfdException::CfdException(this_00,kCfdIllegalStateError,&local_38);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return;
}

Assistant:

void TapBranch::AddBranch(const TapBranch& branch) {
  branch_list_.emplace_back(branch);
  if (branch_list_.size() > TaprootScriptTree::kTaprootControlMaxNodeCount) {
    throw CfdException(
        CfdError::kCfdIllegalStateError, "tapbranch maximum over.");
  }
}